

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::ScalarReplacementPass::CheckUses(ScalarReplacementPass *this,Instruction *inst)

{
  bool bVar1;
  VariableStats stats;
  VariableStats local_8;
  
  local_8.num_partial_accesses = 0;
  local_8.num_full_accesses = 0;
  bVar1 = CheckUses(this,inst,&local_8);
  return bVar1;
}

Assistant:

bool ScalarReplacementPass::CheckUses(const Instruction* inst) const {
  VariableStats stats = {0, 0};
  bool ok = CheckUses(inst, &stats);

  // TODO(alanbaker/greg-lunarg): Add some meaningful heuristics about when
  // SRoA is costly, such as when the structure has many (unaccessed?)
  // members.

  return ok;
}